

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O0

void __thiscall antlr::Parser::match(Parser *this,BitSet *b)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  ostream *poVar4;
  void *this_00;
  undefined8 uVar5;
  BitSet *in_RSI;
  RefToken *in_RDI;
  int unaff_retaddr;
  char **in_stack_00000008;
  MismatchedTokenException *in_stack_00000010;
  string *in_stack_00000020;
  BitSet *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  BitSet *in_stack_ffffffffffffff58;
  undefined1 local_70 [72];
  undefined1 local_28 [23];
  undefined1 in_stack_ffffffffffffffef;
  RefToken *token_;
  
  token_ = in_RDI;
  if ((DEBUG_PARSER & 1) != 0) {
    (**(code **)&in_RDI->ref[0xd].count)();
    poVar4 = std::operator<<((ostream *)&std::cout,"enter match(");
    poVar4 = std::operator<<(poVar4,"bitset");
    poVar4 = std::operator<<(poVar4,") with LA(1)=");
    iVar2 = (*(code *)in_RDI->ref[1].ptr)(in_RDI,1);
    this_00 = (void *)std::ostream::operator<<(poVar4,iVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  (*(code *)in_RDI->ref[1].ptr)(in_RDI,1);
  bVar1 = BitSet::member(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  if (!bVar1) {
    if ((DEBUG_PARSER & 1) != 0) {
      (**(code **)&in_RDI->ref[0xd].count)();
      poVar4 = std::operator<<((ostream *)&std::cout,"token mismatch: ");
      iVar2 = (*(code *)in_RDI->ref[1].ptr)(in_RDI,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," not member of ");
      poVar4 = std::operator<<(poVar4,"bitset");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    uVar5 = __cxa_allocate_exception(200);
    (**(code **)&in_RDI->ref[0xc].count)();
    uVar3 = (*(code *)in_RDI->ref[0xd].ptr)();
    (**(code **)&in_RDI->ref[1].count)(local_28,in_RDI,1);
    BitSet::BitSet((BitSet *)CONCAT44(uVar3,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
    (*(code *)in_RDI->ref[4].ptr)(local_70);
    MismatchedTokenException::MismatchedTokenException
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,token_,in_RSI,
               (bool)in_stack_ffffffffffffffef,in_stack_00000020);
    __cxa_throw(uVar5,&MismatchedTokenException::typeinfo,
                MismatchedTokenException::~MismatchedTokenException);
  }
  (*(code *)in_RDI->ref[6].ptr)();
  return;
}

Assistant:

virtual void match(const BitSet& b)
	{
		if ( DEBUG_PARSER )
		{
			traceIndent();
			ANTLR_USE_NAMESPACE(std)cout << "enter match(" << "bitset" /*b.toString()*/
				<< ") with LA(1)=" << LA(1) << ANTLR_USE_NAMESPACE(std)endl;
		}
		if ( !b.member(LA(1)) )
		{
			if ( DEBUG_PARSER )
			{
				traceIndent();
				ANTLR_USE_NAMESPACE(std)cout << "token mismatch: " << LA(1) << " not member of "
					<< "bitset" /*b.toString()*/ << ANTLR_USE_NAMESPACE(std)endl;
			}
			throw MismatchedTokenException(getTokenNames(), getNumTokens(), LT(1), b, false, getFilename());
		}
		else
		{
			// mark token as consumed -- fetch next token deferred until LA/LT
			consume();
		}
	}